

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O2

void cmDyndepCollation::AddCollationInformation
               (Value *tdi,cmGeneratorTarget *gt,string *config,cmDyndepGeneratorCallbacks *cb)

{
  size_type *value;
  _Rb_tree_header *__x;
  int iVar1;
  cmTarget *this;
  pointer puVar2;
  cmInstallGenerator *pcVar3;
  _Base_ptr p_Var4;
  cmMakefile *pcVar5;
  cmInstallExportGenerator *this_00;
  pointer puVar6;
  cmExportBuildFileGenerator *pcVar7;
  pointer ppcVar8;
  pointer pTVar9;
  pointer puVar10;
  bool bVar11;
  __type _Var12;
  uint uVar13;
  cmGeneratorTarget *this_01;
  cmInstallFileSetGenerator *this_02;
  iterator iVar14;
  string *psVar15;
  Value *pVVar16;
  Value *pVVar17;
  _Base_ptr p_Var18;
  cmInstallCxxModuleBmiGenerator *pcVar19;
  cmGlobalGenerator *pcVar20;
  _Base_ptr p_Var21;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *pvVar22;
  long lVar23;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig;
  pointer ppcVar24;
  pointer puVar25;
  cmInstallCxxModuleBmiGenerator *this_03;
  pointer puVar26;
  pointer name;
  long lVar27;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig_1;
  pointer __lhs;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  pointer pTVar28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  char *pcVar29;
  allocator<char> local_249;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
  sf_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files_per_dirs;
  Value fs_dest;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> cxxModuleSources;
  string dest;
  string fs_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> obj_path;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  string_view local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  this = gt->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_(&all_file_sets,this);
  Json::Value::Value((Value *)&dest,objectValue);
  for (name = all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      name != all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
    this_01 = (cmGeneratorTarget *)cmTarget::GetFileSet(this,name);
    if (this_01 == (cmGeneratorTarget *)0x0) {
      pcVar5 = gt->Makefile;
      psVar15 = cmTarget::GetName_abi_cxx11_(this);
      cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[32],std::__cxx11::string_const&,char_const(&)[25]>
                ((string *)&files_per_dirs,(char (*) [9])0x68b650,psVar15,
                 (char (*) [32])"\" is tracked to have file set \"",name,
                 (char (*) [25])"\", but it was not found.");
      cmMakefile::IssueMessage(pcVar5,INTERNAL_ERROR,(string *)&files_per_dirs);
      psVar15 = (string *)&files_per_dirs;
    }
    else {
      value = &(this_01->ObjectDirectory)._M_string_length;
      std::__cxx11::string::string((string *)&fs_type,(string *)value);
      __x_00._M_str = fs_type._M_dataplus._M_p;
      __x_00._M_len = fs_type._M_string_length;
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      bVar11 = std::operator!=(__x_00,__y);
      if (!bVar11) {
        cmFileSet::CompileFileEntries(&fileEntries,(cmFileSet *)this_01);
        pcVar29 = (char *)0x380179;
        cmFileSet::CompileDirectoryEntries(&directoryEntries,(cmFileSet *)this_01);
        cmFileSet::EvaluateDirectoryEntries
                  (&directories,(cmFileSet *)this_01,&directoryEntries,gt->LocalGenerator,config,gt,
                   (cmGeneratorExpressionDAGChecker *)0x0);
        puVar10 = fileEntries.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header;
        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (cge = fileEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; cge != puVar10; cge = cge + 1) {
          pcVar29 = (char *)0x0;
          cmFileSet::EvaluateFileEntry
                    ((cmFileSet *)this_01,&directories,&files_per_dirs,cge,gt->LocalGenerator,config
                     ,gt,(cmGeneratorExpressionDAGChecker *)0x0);
        }
        sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &sf_map._M_t._M_impl.super__Rb_tree_header._M_header;
        sf_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fs_dest.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )&sf_map;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fs_dest.value_ = (ValueHolder)gt;
        fs_dest._8_8_ = this;
        cmGeneratorTarget::GetObjectSources(gt,&objectSources,config);
        ppcVar8 = objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar24 = objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar24 != ppcVar8;
            ppcVar24 = ppcVar24 + 1) {
          anon_unknown.dwarf_11d9ccf::CollationInformationCxxModules::anon_class_24_3_20354611::
          operator()((anon_class_24_3_20354611 *)&fs_dest,*ppcVar24,ObjectAndBmi);
        }
        cxxModuleSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        cxxModuleSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        cxxModuleSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetCxxModuleSources(gt,&cxxModuleSources,config);
        ppcVar8 = cxxModuleSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar24 = cxxModuleSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar24 != ppcVar8;
            ppcVar24 = ppcVar24 + 1) {
          anon_unknown.dwarf_11d9ccf::CollationInformationCxxModules::anon_class_24_3_20354611::
          operator()((anon_class_24_3_20354611 *)&fs_dest,*ppcVar24,BmiOnly);
        }
        std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
        ~_Vector_base((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      &cxxModuleSources);
        std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
        ~_Vector_base(&objectSources.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     );
        Json::Value::Value(&fs_dest,nullValue);
        puVar2 = (gt->Makefile->InstallGenerators).
                 super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar25 = (gt->Makefile->InstallGenerators).
                       super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar2;
            puVar25 = puVar25 + 1) {
          pcVar3 = (puVar25->_M_t).
                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
          if (pcVar3 != (cmInstallGenerator *)0x0) {
            pcVar29 = (char *)0x0;
            this_02 = (cmInstallFileSetGenerator *)
                      __dynamic_cast(pcVar3,&cmInstallGenerator::typeinfo,
                                     &cmInstallFileSetGenerator::typeinfo);
            if (((this_02 != (cmInstallFileSetGenerator *)0x0) &&
                (pcVar29 = (char *)gt, this_02->Target == gt)) &&
               (pcVar29 = (char *)this_01, (cmGeneratorTarget *)this_02->FileSet == this_01)) {
              cmInstallFileSetGenerator::GetDestination((string *)&cxxModuleSources,this_02,config);
              Json::Value::Value((Value *)&objectSources,(string *)&cxxModuleSources);
              Json::Value::operator=(&fs_dest,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              std::__cxx11::string::~string((string *)&cxxModuleSources);
            }
          }
        }
        for (p_Var18 = files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &files_per_dirs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          p_Var4 = p_Var18[2]._M_parent;
          for (p_Var21 = *(_Base_ptr *)(p_Var18 + 2); p_Var21 != p_Var4; p_Var21 = p_Var21 + 1) {
            cmsys::SystemTools::CollapseFullPath((string *)&cxxModuleSources,(string *)p_Var21);
            __x = &sf_map._M_t._M_impl.super__Rb_tree_header;
            iVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                     ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                                       *)sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent,(_Link_type)__x,(_Base_ptr)&cxxModuleSources,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)pcVar29);
            if (((_Rb_tree_header *)iVar14._M_node == __x) ||
               (bVar11 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cxxModuleSources,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(iVar14._M_node + 1)), bVar11)) {
              pcVar5 = gt->Makefile;
              psVar15 = cmTarget::GetName_abi_cxx11_(this);
              pcVar29 = "\" has source file\n  ";
              cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[75]>
                        ((string *)&objectSources,(char (*) [9])0x68b650,psVar15,
                         (char (*) [21])"\" has source file\n  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var21,(char (*) [75])
                                 "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not scheduled for compilation."
                        );
              cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,(string *)&objectSources);
              std::__cxx11::string::~string((string *)&objectSources);
            }
            else if (*(cmSourceFile **)(iVar14._M_node + 2) == (cmSourceFile *)0x0) {
              pcVar5 = gt->Makefile;
              psVar15 = cmTarget::GetName_abi_cxx11_(this);
              pcVar29 = "\" has source file \"";
              cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[20],std::__cxx11::string_const&,char_const(&)[39]>
                        ((string *)&objectSources,(char (*) [9])0x68b650,psVar15,
                         (char (*) [20])"\" has source file \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var21,(char (*) [39])"\" which has not been tracked properly.");
              cmMakefile::IssueMessage(pcVar5,INTERNAL_ERROR,(string *)&objectSources);
              std::__cxx11::string::~string((string *)&objectSources);
            }
            else {
              iVar1 = *(int *)&iVar14._M_node[2]._M_parent;
              pcVar29 = (char *)config;
              std::
              function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(&obj_path,&cb->ObjectFilePath + (iVar1 != 0),
                           *(cmSourceFile **)(iVar14._M_node + 2),config);
              Json::Value::Value((Value *)&objectSources,objectValue);
              pVVar16 = Json::Value::operator[]((Value *)&dest,&obj_path);
              pVVar16 = Json::Value::operator=(pVVar16,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              Json::Value::Value((Value *)&objectSources,(String *)&cxxModuleSources);
              pVVar17 = Json::Value::operator[](pVVar16,"source");
              Json::Value::operator=(pVVar17,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              Json::Value::Value((Value *)&objectSources,iVar1 == 1);
              pVVar17 = Json::Value::operator[](pVVar16,"bmi-only");
              Json::Value::operator=(pVVar17,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              Json::Value::Value((Value *)&objectSources,(String *)(p_Var18 + 1));
              pVVar17 = Json::Value::operator[](pVVar16,"relative-directory");
              Json::Value::operator=(pVVar17,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              Json::Value::Value((Value *)&objectSources,(string *)&this_01->Makefile);
              pVVar17 = Json::Value::operator[](pVVar16,"name");
              Json::Value::operator=(pVVar17,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              Json::Value::Value((Value *)&objectSources,(String *)value);
              pVVar17 = Json::Value::operator[](pVVar16,"type");
              Json::Value::operator=(pVVar17,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              local_70 = (string_view)
                         cmFileSetVisibilityToName
                                   ((this_01->IncludeDirectoriesCache)._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_color);
              std::__cxx11::string::string<cm::static_string_view,void>
                        ((string *)&targets,(static_string_view *)&local_70,&local_249);
              Json::Value::Value((Value *)&objectSources,(String *)&targets);
              pVVar17 = Json::Value::operator[](pVVar16,"visibility");
              Json::Value::operator=(pVVar17,(Value *)&objectSources);
              Json::Value::~Value((Value *)&objectSources);
              std::__cxx11::string::~string((string *)&targets);
              pVVar16 = Json::Value::operator[](pVVar16,"destination");
              Json::Value::operator=(pVVar16,&fs_dest);
              std::__cxx11::string::~string((string *)&obj_path);
            }
            std::__cxx11::string::~string((string *)&cxxModuleSources);
          }
        }
        Json::Value::~Value(&fs_dest);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
        ::~map(&sf_map);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&files_per_dirs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&directories);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&directoryEntries);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&fileEntries);
      }
      psVar15 = &fs_type;
    }
    std::__cxx11::string::~string((string *)psVar15);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_file_sets);
  pVVar16 = Json::Value::operator[](tdi,"cxx-modules");
  Json::Value::operator=(pVVar16,(Value *)&dest);
  Json::Value::~Value((Value *)&dest);
  puVar2 = (gt->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = (cmInstallCxxModuleBmiGenerator *)0x0;
  for (puVar25 = (gt->Makefile->InstallGenerators).
                 super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar2; puVar25 = puVar25 + 1
      ) {
    pcVar3 = (puVar25->_M_t).
             super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>.
             super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
    if (((pcVar3 == (cmInstallGenerator *)0x0) ||
        (pcVar19 = (cmInstallCxxModuleBmiGenerator *)
                   __dynamic_cast(pcVar3,&cmInstallGenerator::typeinfo,
                                  &cmInstallCxxModuleBmiGenerator::typeinfo,0),
        pcVar19 == (cmInstallCxxModuleBmiGenerator *)0x0)) || (pcVar19->Target != gt)) {
      pcVar19 = this_03;
    }
    this_03 = pcVar19;
  }
  if (this_03 == (cmInstallCxxModuleBmiGenerator *)0x0) {
    Json::Value::Value((Value *)&sf_map,nullValue);
  }
  else {
    Json::Value::Value((Value *)&sf_map,objectValue);
    Json::Value::Value((Value *)&files_per_dirs,&this_03->FilePermissions);
    pVVar16 = Json::Value::operator[]((Value *)&sf_map,"permissions");
    Json::Value::operator=(pVVar16,(Value *)&files_per_dirs);
    Json::Value::~Value((Value *)&files_per_dirs);
    cmInstallCxxModuleBmiGenerator::GetDestination((string *)&fs_dest,this_03,config);
    Json::Value::Value((Value *)&files_per_dirs,(String *)&fs_dest);
    pVVar16 = Json::Value::operator[]((Value *)&sf_map,"destination");
    Json::Value::operator=(pVVar16,(Value *)&files_per_dirs);
    Json::Value::~Value((Value *)&files_per_dirs);
    std::__cxx11::string::~string((string *)&fs_dest);
    uVar13 = (this_03->super_cmInstallGenerator).Message - MessageAlways;
    if (uVar13 < 3) {
      pcVar29 = &DAT_006cd538 + *(int *)(&DAT_006cd538 + (ulong)uVar13 * 4);
    }
    else {
      pcVar29 = "";
    }
    Json::Value::Value((Value *)&files_per_dirs,pcVar29);
    pVVar16 = Json::Value::operator[]((Value *)&sf_map,"message-level");
    Json::Value::operator=(pVVar16,(Value *)&files_per_dirs);
    Json::Value::~Value((Value *)&files_per_dirs);
    cmInstallCxxModuleBmiGenerator::GetScriptLocation((string *)&fs_dest,this_03,config);
    Json::Value::Value((Value *)&files_per_dirs,(String *)&fs_dest);
    pVVar16 = Json::Value::operator[]((Value *)&sf_map,"script-location");
    Json::Value::operator=(pVVar16,(Value *)&files_per_dirs);
    Json::Value::~Value((Value *)&files_per_dirs);
    std::__cxx11::string::~string((string *)&fs_dest);
  }
  pVVar16 = Json::Value::operator[](tdi,"bmi-installation");
  Json::Value::operator=(pVVar16,(Value *)&sf_map);
  Json::Value::~Value((Value *)&sf_map);
  Json::Value::Value(&fs_dest,arrayValue);
  cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&cxxModuleSources,gt);
  pcVar20 = cmGeneratorTarget::GetGlobalGenerator(gt);
  for (p_Var18 = (pcVar20->ExportSets).
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var18 !=
      &(pcVar20->ExportSets).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
    p_Var21 = *(_Base_ptr *)(p_Var18 + 2);
    p_Var4 = p_Var18[2]._M_parent;
    lVar23 = (long)p_Var4 - (long)p_Var21;
    for (lVar27 = lVar23 >> 5; 0 < lVar27; lVar27 = lVar27 + -1) {
      if (*(cmGeneratorTarget **)(*(long *)p_Var21 + 0x20) == gt) goto LAB_00380b9d;
      if (*(cmGeneratorTarget **)(p_Var21->_M_parent + 1) == gt) {
        p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
        goto LAB_00380b9d;
      }
      if (*(cmGeneratorTarget **)(p_Var21->_M_left + 1) == gt) {
        p_Var21 = (_Base_ptr)&p_Var21->_M_left;
        goto LAB_00380b9d;
      }
      if (*(cmGeneratorTarget **)(p_Var21->_M_right + 1) == gt) {
        p_Var21 = (_Base_ptr)&p_Var21->_M_right;
        goto LAB_00380b9d;
      }
      p_Var21 = p_Var21 + 1;
      lVar23 = lVar23 + -0x20;
    }
    lVar23 = lVar23 >> 3;
    if (lVar23 == 1) {
LAB_00380b7c:
      if (*(cmGeneratorTarget **)(*(long *)p_Var21 + 0x20) != gt) {
        p_Var21 = p_Var4;
      }
LAB_00380b9d:
      if (p_Var21 != p_Var4) {
        p_Var4 = *(_Base_ptr *)(p_Var18 + 4);
        for (p_Var21 = p_Var18[3]._M_right; p_Var21 != p_Var4;
            p_Var21 = (_Base_ptr)&p_Var21->_M_parent) {
          this_00 = *(cmInstallExportGenerator **)p_Var21;
          Json::Value::Value((Value *)&files_per_dirs,objectValue);
          std::__cxx11::string::string
                    ((string *)&objectSources,(string *)&this_00->CxxModulesDirectory);
          cmInstallExportGenerator::GetTempDir_abi_cxx11_(&dest,this_00);
          Json::Value::Value((Value *)&sf_map,&this_00->Namespace);
          pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"namespace");
          Json::Value::operator=(pVVar16,(Value *)&sf_map);
          Json::Value::~Value((Value *)&sf_map);
          Json::Value::Value((Value *)&sf_map,(String *)&cxxModuleSources);
          pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"export-name");
          Json::Value::operator=(pVVar16,(Value *)&sf_map);
          Json::Value::~Value((Value *)&sf_map);
          Json::Value::Value((Value *)&sf_map,&(this_00->super_cmInstallGenerator).Destination);
          pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"destination");
          Json::Value::operator=(pVVar16,(Value *)&sf_map);
          Json::Value::~Value((Value *)&sf_map);
          Json::Value::Value((Value *)&sf_map,(String *)&objectSources);
          pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"cxx-module-info-dir");
          Json::Value::operator=(pVVar16,(Value *)&sf_map);
          Json::Value::~Value((Value *)&sf_map);
          Json::Value::Value((Value *)&sf_map,&dest);
          pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"export-prefix");
          Json::Value::operator=(pVVar16,(Value *)&sf_map);
          Json::Value::~Value((Value *)&sf_map);
          Json::Value::Value((Value *)&sf_map,true);
          pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"install");
          Json::Value::operator=(pVVar16,(Value *)&sf_map);
          Json::Value::~Value((Value *)&sf_map);
          Json::Value::append(&fs_dest,(Value *)&files_per_dirs);
          std::__cxx11::string::~string((string *)&dest);
          std::__cxx11::string::~string((string *)&objectSources);
          Json::Value::~Value((Value *)&files_per_dirs);
        }
      }
    }
    else {
      if (lVar23 == 2) {
LAB_00380b6b:
        if (*(cmGeneratorTarget **)(*(long *)p_Var21 + 0x20) != gt) {
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          goto LAB_00380b7c;
        }
        goto LAB_00380b9d;
      }
      if (lVar23 == 3) {
        if (*(cmGeneratorTarget **)(*(long *)p_Var21 + 0x20) != gt) {
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          goto LAB_00380b6b;
        }
        goto LAB_00380b9d;
      }
    }
  }
  pvVar22 = cmMakefile::GetExportBuildFileGenerators(gt->Makefile);
  puVar26 = (pvVar22->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (pvVar22->
           super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar26 == puVar6) {
      std::__cxx11::string::~string((string *)&cxxModuleSources);
      pVVar16 = Json::Value::operator[](tdi,"exports");
      Json::Value::operator=(pVVar16,&fs_dest);
      Json::Value::~Value(&fs_dest);
      Json::Value::Value((Value *)&files_per_dirs,config);
      pVVar16 = Json::Value::operator[](tdi,"config");
      Json::Value::operator=(pVVar16,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      return;
    }
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmExportBuildFileGenerator::GetTargets
              ((puVar26->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl,&targets);
    psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
    pTVar9 = targets.
             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __lhs = targets.
            super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
            ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&obj_path,(string *)psVar15);
    std::__cxx11::string::string((string *)&fs_type,(string *)&obj_path);
    std::__cxx11::string::string((string *)&dest,(string *)&fs_type);
    std::__cxx11::string::string((string *)&objectSources,(string *)&dest);
    std::__cxx11::string::string((string *)&files_per_dirs,(string *)&objectSources);
    std::__cxx11::string::string((string *)&sf_map,(string *)&files_per_dirs);
    std::__cxx11::string::~string((string *)&files_per_dirs);
    std::__cxx11::string::string((string *)&files_per_dirs,(string *)&sf_map);
    lVar27 = (long)pTVar9 - (long)__lhs;
    for (lVar23 = lVar27 >> 8; 0 < lVar23; lVar23 = lVar23 + -1) {
      _Var12 = std::operator==(&__lhs->Name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &files_per_dirs);
      pTVar28 = __lhs;
      if (_Var12) goto LAB_00380f1d;
      _Var12 = std::operator==(&__lhs[1].Name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &files_per_dirs);
      pTVar28 = __lhs + 1;
      if (_Var12) goto LAB_00380f1d;
      _Var12 = std::operator==(&__lhs[2].Name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &files_per_dirs);
      pTVar28 = __lhs + 2;
      if (_Var12) goto LAB_00380f1d;
      _Var12 = std::operator==(&__lhs[3].Name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &files_per_dirs);
      pTVar28 = __lhs + 3;
      if (_Var12) goto LAB_00380f1d;
      __lhs = __lhs + 4;
      lVar27 = lVar27 + -0x100;
    }
    lVar27 = lVar27 >> 6;
    if (lVar27 == 1) {
LAB_0038116d:
      _Var12 = std::operator==(&__lhs->Name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &files_per_dirs);
      pTVar28 = __lhs;
      if (!_Var12) {
        pTVar28 = pTVar9;
      }
    }
    else if (lVar27 == 2) {
LAB_0038114d:
      _Var12 = std::operator==(&__lhs->Name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &files_per_dirs);
      pTVar28 = __lhs;
      if (!_Var12) {
        __lhs = __lhs + 1;
        goto LAB_0038116d;
      }
    }
    else {
      pTVar28 = pTVar9;
      if ((lVar27 == 3) &&
         (_Var12 = std::operator==(&__lhs->Name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&files_per_dirs), pTVar28 = __lhs, !_Var12)) {
        __lhs = __lhs + 1;
        goto LAB_0038114d;
      }
    }
LAB_00380f1d:
    std::__cxx11::string::~string((string *)&files_per_dirs);
    std::__cxx11::string::~string((string *)&sf_map);
    std::__cxx11::string::~string((string *)&objectSources);
    std::__cxx11::string::~string((string *)&dest);
    std::__cxx11::string::~string((string *)&fs_type);
    std::__cxx11::string::~string((string *)&obj_path);
    if (pTVar28 != pTVar9) {
      Json::Value::Value((Value *)&files_per_dirs,objectValue);
      std::__cxx11::string::string
                ((string *)&objectSources,
                 (string *)
                 &(((puVar26->_M_t).
                    super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                    .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl)->
                  super_cmExportFileGenerator).Namespace);
      psVar15 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar26->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      pcVar7 = (puVar26->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      cmsys::SystemTools::GetParentDirectory(&dest,psVar15);
      psVar15 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar26->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&fs_type,psVar15);
      Json::Value::Value((Value *)&sf_map,(String *)&objectSources);
      pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"namespace");
      Json::Value::operator=(pVVar16,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&sf_map,(String *)&cxxModuleSources);
      pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"export-name");
      Json::Value::operator=(pVVar16,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&sf_map,&dest);
      pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"destination");
      Json::Value::operator=(pVVar16,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&sf_map,&pcVar7->CxxModulesDirectory);
      pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"cxx-module-info-dir");
      Json::Value::operator=(pVVar16,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&sf_map,&fs_type);
      pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"export-prefix");
      Json::Value::operator=(pVVar16,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&sf_map,false);
      pVVar16 = Json::Value::operator[]((Value *)&files_per_dirs,"install");
      Json::Value::operator=(pVVar16,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::append(&fs_dest,(Value *)&files_per_dirs);
      std::__cxx11::string::~string((string *)&fs_type);
      std::__cxx11::string::~string((string *)&dest);
      std::__cxx11::string::~string((string *)&objectSources);
      Json::Value::~Value((Value *)&files_per_dirs);
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector(&targets);
    puVar26 = puVar26 + 1;
  } while( true );
}

Assistant:

void cmDyndepCollation::AddCollationInformation(
  Json::Value& tdi, cmGeneratorTarget const* gt, std::string const& config,
  cmDyndepGeneratorCallbacks const& cb)
{
  tdi["cxx-modules"] = CollationInformationCxxModules(gt, config, cb);
  tdi["bmi-installation"] = CollationInformationBmiInstallation(gt, config);
  tdi["exports"] = CollationInformationExports(gt);
  tdi["config"] = config;
}